

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O0

int __thiscall
ncnn::Crop::forward(Crop *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  Crop *in_RDI;
  int *_hoffset_00;
  Mat borderm;
  Mat m;
  int q;
  Mat bottom_blob_sliced;
  int _outc;
  int _outh;
  int _outw;
  int _coffset;
  int _hoffset;
  int _woffset;
  Mat *top_blob;
  size_t elemsize;
  int dims;
  int channels;
  int h;
  int w;
  Mat *reference_blob;
  Mat *bottom_blob;
  Mat *this_00;
  Mat *this_01;
  int in_stack_fffffffffffffda0;
  undefined2 in_stack_fffffffffffffda4;
  undefined1 in_stack_fffffffffffffda6;
  undefined1 in_stack_fffffffffffffda7;
  Mat *in_stack_fffffffffffffda8;
  int local_1c8;
  Mat local_1c0;
  undefined1 local_180 [64];
  Mat local_140;
  Mat local_100;
  Mat local_b0;
  undefined1 local_70 [8];
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  reference local_58;
  Allocator *local_50;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  const_reference local_38;
  const_reference local_30;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_30 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_38 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,1);
  local_3c = local_30->w;
  local_40 = local_30->h;
  local_44 = local_30->c;
  local_48 = local_30->dims;
  local_50 = (Allocator *)local_30->elemsize;
  local_58 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
  if (in_RDI->woffset == -0xe9) {
    Mat::shape(in_stack_fffffffffffffda8);
    in_stack_fffffffffffffda8 = (Mat *)Mat::operator_cast_to_int_(local_38);
    this_01 = (Mat *)local_70;
    this_00 = (Mat *)(local_70 + 4);
    _hoffset_00 = &local_60;
    resolve_crop_roi(in_RDI,&local_b0,(int *)in_stack_fffffffffffffda8,&local_5c,_hoffset_00,
                     &local_64,&local_68,(int *)this_00,(int *)this_01);
    Mat::~Mat((Mat *)0x14a371);
  }
  else {
    Mat::shape(in_stack_fffffffffffffda8);
    Mat::shape(in_stack_fffffffffffffda8);
    this_01 = (Mat *)local_70;
    this_00 = (Mat *)(local_70 + 4);
    _hoffset_00 = &local_60;
    resolve_crop_roi(in_RDI,&local_100,&local_140,&local_5c,_hoffset_00,&local_64,&local_68,
                     (int *)this_00,(int *)this_01);
    Mat::~Mat((Mat *)0x14a42f);
    Mat::~Mat((Mat *)0x14a43c);
  }
  iVar3 = (int)((ulong)in_stack_fffffffffffffda8 >> 0x20);
  if (local_48 == 1) {
    if (local_68 == local_3c) {
      Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      Mat::create((Mat *)in_RDI,iVar3,
                  CONCAT17(in_stack_fffffffffffffda7,
                           CONCAT16(in_stack_fffffffffffffda6,
                                    CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))),
                  (Allocator *)this_01);
      bVar1 = Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_50 == (Allocator *)0x1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                     CONCAT13(in_stack_fffffffffffffda7,
                              CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                     in_stack_fffffffffffffda0);
        }
        if (local_50 == (Allocator *)0x2) {
          copy_cut_border_image<unsigned_short>
                    ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                     CONCAT13(in_stack_fffffffffffffda7,
                              CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                     in_stack_fffffffffffffda0);
        }
        if (local_50 == (Allocator *)0x4) {
          copy_cut_border_image<float>
                    ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                     CONCAT13(in_stack_fffffffffffffda7,
                              CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                     in_stack_fffffffffffffda0);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_48 == 2) {
    if ((local_68 == local_3c) && (local_70._4_4_ == local_40)) {
      Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      Mat::create((Mat *)in_RDI,iVar3,(int)in_stack_fffffffffffffda8,
                  CONCAT17(in_stack_fffffffffffffda7,
                           CONCAT16(in_stack_fffffffffffffda6,
                                    CONCAT24(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0))),
                  (Allocator *)this_01);
      bVar1 = Mat::empty(this_00);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        if (local_50 == (Allocator *)0x1) {
          copy_cut_border_image<signed_char>
                    ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                     CONCAT13(in_stack_fffffffffffffda7,
                              CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                     in_stack_fffffffffffffda0);
        }
        if (local_50 == (Allocator *)0x2) {
          copy_cut_border_image<unsigned_short>
                    ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                     CONCAT13(in_stack_fffffffffffffda7,
                              CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                     in_stack_fffffffffffffda0);
        }
        if (local_50 == (Allocator *)0x4) {
          copy_cut_border_image<float>
                    ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                     CONCAT13(in_stack_fffffffffffffda7,
                              CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                     in_stack_fffffffffffffda0);
        }
        local_4 = 0;
      }
    }
  }
  else if (local_48 == 3) {
    if (((local_68 == local_3c) && (local_70._4_4_ == local_40)) && (local_70._0_4_ == local_44)) {
      Mat::operator=(this_01,this_00);
      local_4 = 0;
    }
    else {
      iVar3 = local_70._0_4_;
      Mat::channel_range(in_stack_fffffffffffffda8,
                         CONCAT13(in_stack_fffffffffffffda7,
                                  CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                         in_stack_fffffffffffffda0);
      if ((local_68 == local_3c) && (local_70._4_4_ == local_40)) {
        Mat::clone(&local_1c0,(__fn *)local_180,(void *)0x0,iVar3,_hoffset_00);
        Mat::operator=(this_01,this_00);
        Mat::~Mat((Mat *)0x14a7cc);
        bVar1 = Mat::empty(this_00);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          local_4 = 0;
        }
      }
      else {
        Mat::create((Mat *)in_RDI,(int)((ulong)in_stack_fffffffffffffda8 >> 0x20),
                    (int)in_stack_fffffffffffffda8,
                    CONCAT13(in_stack_fffffffffffffda7,
                             CONCAT12(in_stack_fffffffffffffda6,in_stack_fffffffffffffda4)),
                    (size_t)this_01,(Allocator *)this_00);
        uVar2 = Mat::empty(this_00);
        if ((bool)uVar2) {
          local_4 = -100;
        }
        else {
          for (local_1c8 = 0; local_1c8 < (int)local_70._0_4_; local_1c8 = local_1c8 + 1) {
            Mat::channel(this_01,(int)((ulong)this_00 >> 0x20));
            Mat::channel(this_01,(int)((ulong)this_00 >> 0x20));
            if (local_50 == (Allocator *)0x1) {
              copy_cut_border_image<signed_char>
                        ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                         CONCAT13(in_stack_fffffffffffffda7,
                                  CONCAT12(uVar2,in_stack_fffffffffffffda4)),
                         in_stack_fffffffffffffda0);
            }
            if (local_50 == (Allocator *)0x2) {
              copy_cut_border_image<unsigned_short>
                        ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                         CONCAT13(in_stack_fffffffffffffda7,
                                  CONCAT12(uVar2,in_stack_fffffffffffffda4)),
                         in_stack_fffffffffffffda0);
            }
            if (local_50 == (Allocator *)0x4) {
              copy_cut_border_image<float>
                        ((Mat *)in_RDI,in_stack_fffffffffffffda8,
                         CONCAT13(in_stack_fffffffffffffda7,
                                  CONCAT12(uVar2,in_stack_fffffffffffffda4)),
                         in_stack_fffffffffffffda0);
            }
            Mat::~Mat((Mat *)0x14a9ed);
            Mat::~Mat((Mat *)0x14a9f7);
          }
          local_4 = 0;
        }
      }
      Mat::~Mat((Mat *)0x14aa3c);
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int Crop::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& reference_blob = bottom_blobs[1];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    Mat& top_blob = top_blobs[0];

    int _woffset, _hoffset, _coffset;
    int _outw, _outh, _outc;
    if (woffset == -233)
    {
        resolve_crop_roi(bottom_blob.shape(), (const int*)reference_blob, _woffset, _hoffset, _coffset, _outw, _outh, _outc);
    }
    else
    {
        resolve_crop_roi(bottom_blob.shape(), reference_blob.shape(), _woffset, _hoffset, _coffset, _outw, _outh, _outc);
    }

    if (dims == 1)
    {
        if (_outw == w)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, 0, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, 0, _woffset);

        return 0;
    }

    if (dims == 2)
    {
        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_outw, _outh, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (elemsize == 1)
            copy_cut_border_image<signed char>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 2)
            copy_cut_border_image<unsigned short>(bottom_blob, top_blob, _hoffset, _woffset);
        if (elemsize == 4)
            copy_cut_border_image<float>(bottom_blob, top_blob, _hoffset, _woffset);

        return 0;
    }

    if (dims == 3)
    {
        if (_outw == w && _outh == h && _outc == channels)
        {
            top_blob = bottom_blob;
            return 0;
        }

        const Mat bottom_blob_sliced = bottom_blob.channel_range(_coffset, _outc);

        if (_outw == w && _outh == h)
        {
            top_blob = bottom_blob_sliced.clone();
            if (top_blob.empty())
                return -100;

            return 0;
        }

        top_blob.create(_outw, _outh, _outc, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<_outc; q++)
        {
            const Mat m = bottom_blob_sliced.channel(q);
            Mat borderm = top_blob.channel(q);

            if (elemsize == 1)
                copy_cut_border_image<signed char>(m, borderm, _hoffset, _woffset);
            if (elemsize == 2)
                copy_cut_border_image<unsigned short>(m, borderm, _hoffset, _woffset);
            if (elemsize == 4)
                copy_cut_border_image<float>(m, borderm, _hoffset, _woffset);
        }

        return 0;
    }

    return 0;
}